

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

QNetworkCacheMetaData __thiscall
QNetworkReplyHttpImplPrivate::fetchCacheMetaData
          (QNetworkReplyHttpImplPrivate *this,QNetworkCacheMetaData *oldMetaData)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  Operation OVar4;
  qsizetype qVar5;
  ulong uVar6;
  Node<QByteArray,_QByteArray> *pNVar7;
  undefined1 **ppuVar8;
  QNetworkCacheMetaData *in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar9;
  long lVar10;
  long i;
  ulong uVar11;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView value_00;
  QLatin1StringView QVar12;
  QByteArrayView QVar13;
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView newValue;
  Attribute copy;
  QDateTime dt;
  QHttpHeaders newHeaders;
  QHttpHeaders cacheHeaders;
  QByteArrayView headers [3];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_d0;
  size_t local_c0;
  QHash<QNetworkRequest::Attribute,_QVariant> local_a0;
  QByteArray local_98;
  QHash<QByteArray,_QByteArray> this_00;
  QHash<QByteArray,_QByteArray> QVar14;
  QHttpHeaders QVar15;
  QNetworkCacheMetaData local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  
  local_38 = *(undefined1 **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&this->super_QNetworkReplyPrivate = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::QNetworkCacheMetaData((QNetworkCacheMetaData *)this,in_RDX);
  local_70.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers(&local_70);
  QVar15.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&stack0xffffffffffffff88);
  qVar5 = QHttpHeaders::size((QHttpHeaders *)&stack0xffffffffffffff88);
  if (0 < qVar5) {
    i = 0;
    do {
      QVar12 = QHttpHeaders::nameAt((QHttpHeaders *)&stack0xffffffffffffff88,i);
      aVar9 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar12.m_data;
      uVar6 = QVar12.m_size;
      QVar13 = QHttpHeaders::valueAt((QHttpHeaders *)&stack0xffffffffffffff88,i);
      uVar11 = 3;
      lVar10 = 0x20;
      do {
        local_d0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar13.m_data;
        local_c0 = QVar13.m_size;
        iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,
                          *(char **)((long)&PTR_typeinfo_name_002d4748 + lVar10),
                          *(longlong *)((long)&typeinfo + lVar10));
        if (iVar3 == 0) {
          lVar10 = lVar10 + -0x20;
LAB_0021bc26:
          if (lVar10 != 0x80) goto LAB_0021bde8;
          break;
        }
        iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,*(char **)(&UNK_002d4758 + lVar10),
                          *(longlong *)((long)&PTR_typeinfo_002d4750 + lVar10));
        if (iVar3 == 0) {
          lVar10 = lVar10 + -0x10;
          goto LAB_0021bc26;
        }
        iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,*(char **)((long)&DAT_002d4768 + lVar10),
                          *(longlong *)((long)&DAT_002d4760 + lVar10));
        if (iVar3 == 0) goto LAB_0021bc26;
        iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,
                          *(char **)((long)&PTR_anon_var_dwarf_72db20_002d4778 + lVar10),
                          *(longlong *)((long)&DAT_002d4770 + lVar10));
        if (iVar3 == 0) {
          lVar10 = lVar10 + 0x10;
          goto LAB_0021bc26;
        }
        uVar11 = uVar11 - 1;
        lVar10 = lVar10 + 0x40;
      } while (1 < uVar11);
      iVar3 = QtPrivate::compareStrings(uVar6,aVar9.m_data,"set-cookie",10,0);
      if ((iVar3 != 0) &&
         ((((iVar3 = QtPrivate::compareStrings(uVar6,aVar9.m_data,"warning",7,0),
            local_c0 != 3 || iVar3 != 0 || (*local_d0.m_data_utf8 != '1')) ||
           (9 < (int)*(char *)((long)local_d0.m_data + 1) - 0x30U)) ||
          (9 < (int)*(char *)((long)local_d0.m_data + 2) - 0x30U)))) {
        name.m_size = uVar6 | 0x4000000000000000;
        name.field_0.m_data_utf8 = (char *)aVar9.m_data;
        bVar2 = QHttpHeaders::contains((QHttpHeaders *)&local_70,name);
        if (bVar2) {
          local_68._0_8_ = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x10;
          local_68._8_8_ = "content-encoding";
          local_58 = (undefined1 *)0xd;
          local_50 = "content-range";
          local_48 = (undefined1 *)0xc;
          local_40 = "content-type";
          iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,"content-encoding",0x10);
          ppuVar8 = (undefined1 **)local_68;
          if (iVar3 != 0) {
            iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,local_50,(longlong)local_58);
            ppuVar8 = &local_58;
            if (iVar3 != 0) {
              iVar3 = qstrnicmp(aVar9.m_data_utf8,uVar6,local_40,(longlong)local_48);
              ppuVar8 = &local_38;
              if (iVar3 == 0) {
                ppuVar8 = &local_48;
              }
            }
          }
          if (ppuVar8 != &local_38) goto LAB_0021bde8;
        }
        if ((*(int *)&oldMetaData[0x4b].d.d.ptr != 0x130) ||
           (iVar3 = QtPrivate::compareStrings(uVar6,aVar9.m_data,"content-length",0xe,0), iVar3 != 0
           )) {
          name_00.m_size = name.m_size;
          name_00.field_0.m_data_utf8 = (char *)aVar9.m_data;
          newValue.m_size = local_c0;
          newValue.field_0.m_data_utf8 = (char *)local_d0.m_data;
          QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_70,name_00,newValue);
        }
      }
LAB_0021bde8:
      i = i + 1;
      qVar5 = QHttpHeaders::size((QHttpHeaders *)&stack0xffffffffffffff88);
    } while (i < qVar5);
  }
  QNetworkCacheMetaData::setHeaders((QNetworkCacheMetaData *)this,(QHttpHeaders *)&local_70);
  this_00.d = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0;
  QVar13 = QHttpHeaders::value((QHttpHeaders *)&local_70,CacheControl,(QByteArrayView)ZEXT816(0));
  if (QVar13.m_size == 0) {
LAB_0021bf92:
    QVar13 = QHttpHeaders::value((QHttpHeaders *)&local_70,Expires,(QByteArrayView)ZEXT816(0));
    if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      value.m_data = (storage_type *)QVar13.m_size;
      value.m_size = (qsizetype)local_68;
      QNetworkHeadersPrivate::fromHttpDate(value);
      QNetworkCacheMetaData::setExpirationDate((QNetworkCacheMetaData *)this,(QDateTime *)local_68);
      QDateTime::~QDateTime((QDateTime *)local_68);
    }
  }
  else {
    QVar13.m_data = (storage_type *)QVar15.d.d.ptr;
    QVar13.m_size = (qsizetype)this_00.d;
    parseHttpOptionHeader(QVar13);
    QVar14.d = (Data *)local_98.d.d;
    local_98.d.d = (Data *)0x0;
    local_68._0_8_ = this_00.d;
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)local_68);
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&local_98);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = "max-age";
    local_98.d.size = 7;
    QHash<QByteArray,_QByteArray>::value
              ((QByteArray *)local_68,(QHash<QByteArray,_QByteArray> *)&stack0xffffffffffffff80,
               &local_98);
    this_00.d = QVar14.d;
    if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_98.d.d !=
        (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        this_00.d = QVar14.d;
      }
    }
    if (local_58 == (undefined1 *)0x0) {
      if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_68._0_8_ !=
          (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
        LOCK();
        *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_68._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
        }
      }
      goto LAB_0021bf92;
    }
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime::currentDateTimeUtc();
    QByteArray::toInt((bool *)local_68,0);
    QDateTime::addSecs((longlong)&local_a0);
    pDVar1 = local_98.d.d;
    local_98.d.d = (Data *)local_a0.d;
    local_a0.d = (Data *)pDVar1;
    QDateTime::~QDateTime((QDateTime *)&local_a0);
    QNetworkCacheMetaData::setExpirationDate((QNetworkCacheMetaData *)this,(QDateTime *)&local_98);
    QDateTime::~QDateTime((QDateTime *)&local_98);
    if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_68._0_8_ !=
        (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
      }
    }
  }
  QVar13 = QHttpHeaders::value((QHttpHeaders *)&local_70,LastModified,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
    value_00.m_data = (storage_type *)QVar13.m_size;
    value_00.m_size = (qsizetype)local_68;
    QNetworkHeadersPrivate::fromHttpDate(value_00);
    QNetworkCacheMetaData::setLastModified((QNetworkCacheMetaData *)this,(QDateTime *)local_68);
    QDateTime::~QDateTime((QDateTime *)local_68);
  }
  OVar4 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
  if (OVar4 == Get) {
    local_68._0_8_ = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0;
    local_68._8_8_ = "no-store";
    local_58 = (undefined1 *)0x8;
    if (this_00.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      bVar2 = true;
    }
    else {
      pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findNode<QByteArray>
                         (this_00.d,(QByteArray *)local_68);
      bVar2 = pNVar7 == (Node<QByteArray,_QByteArray> *)0x0;
    }
  }
  else {
    OVar4 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
    if (OVar4 != Post) {
      bVar2 = false;
      goto LAB_0021c0d9;
    }
    local_68._0_8_ = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0;
    local_68._8_8_ = "max-age";
    local_58 = (undefined1 *)0x7;
    if (this_00.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      bVar2 = false;
    }
    else {
      pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findNode<QByteArray>
                         (this_00.d,(QByteArray *)local_68);
      bVar2 = pNVar7 != (Node<QByteArray,_QByteArray> *)0x0;
    }
  }
  if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_68._0_8_ !=
      (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
    }
  }
LAB_0021c0d9:
  QNetworkCacheMetaData::setSaveToDisk((QNetworkCacheMetaData *)this,bVar2);
  local_98.d.d = (Data *)0x0;
  iVar3 = *(int *)&oldMetaData[0x4b].d.d.ptr;
  if (iVar3 == 0x130) {
    QNetworkCacheMetaData::attributes(in_RDX);
    local_68._0_8_ = local_98.d.d;
    local_98.d.d = (Data *)local_a0.d;
    local_a0.d = (Data *)0x0;
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)local_68);
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&local_a0);
  }
  else {
    QVariant::QVariant((QVariant *)local_68,iVar3);
    local_a0.d = local_a0.d & 0xffffffff00000000;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&local_98,(Attribute *)&local_a0,
               (QVariant *)local_68);
    QVariant::~QVariant((QVariant *)local_68);
    QVariant::QVariant((QVariant *)local_68,(QString *)(oldMetaData + 0x4c));
    local_a0.d._0_4_ = 1;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&local_98,(Attribute *)&local_a0,
               (QVariant *)local_68);
    QVariant::~QVariant((QVariant *)local_68);
  }
  QNetworkCacheMetaData::setAttributes((QNetworkCacheMetaData *)this,(AttributesMap *)&local_98);
  QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)&local_98);
  QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&stack0xffffffffffffff80);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffff88);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_70);
  if (*(undefined1 **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
         (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)this;
}

Assistant:

QNetworkCacheMetaData QNetworkReplyHttpImplPrivate::fetchCacheMetaData(const QNetworkCacheMetaData &oldMetaData) const
{
    Q_Q(const QNetworkReplyHttpImpl);

    QNetworkCacheMetaData metaData = oldMetaData;
    QHttpHeaders cacheHeaders = metaData.headers();

    const auto newHeaders = q->headers();
    for (qsizetype i = 0; i < newHeaders.size(); ++i) {
        const auto name = newHeaders.nameAt(i);
        const auto value = newHeaders.valueAt(i);

        if (isHopByHop(name))
            continue;

        if (name.compare("set-cookie", Qt::CaseInsensitive) == 0)
            continue;

        // for 4.6.0, we were planning to not store the date header in the
        // cached resource; through that we planned to reduce the number
        // of writes to disk when using a QNetworkDiskCache (i.e. don't
        // write to disk when only the date changes).
        // However, without the date we cannot calculate the age of the page
        // anymore.
        //if (header == "date")
            //continue;

        // Don't store Warning 1xx headers
        if (name.compare("warning", Qt::CaseInsensitive) == 0) {
            if (value.size() == 3
                && value[0] == '1'
                && isAsciiDigit(value[1])
                && isAsciiDigit(value[2]))
                continue;
        }

        if (cacheHeaders.contains(name)) {
            // Match the behavior of Firefox and assume Cache-Control: "no-transform"
            constexpr QByteArrayView headers[]=
                    {"content-encoding", "content-range", "content-type"};
            if (std::any_of(std::begin(headers), std::end(headers), caseInsensitiveCompare(name)))
                continue;
        }

        // IIS has been known to send "Content-Length: 0" on 304 responses, so
        // ignore this too
        if (statusCode == 304 && name.compare("content-length", Qt::CaseInsensitive) == 0)
            continue;

#if defined(QNETWORKACCESSHTTPBACKEND_DEBUG)
        QByteArrayView n = newHeaders.value(name);
        QByteArrayView o = cacheHeaders.value(name);
        if (n != o && name.compare("date", Qt::CaseInsensitive) != 0) {
            qDebug() << "replacing" << name;
            qDebug() << "new" << n;
            qDebug() << "old" << o;
        }
#endif
        cacheHeaders.replaceOrAppend(name, value);
    }
    metaData.setHeaders(cacheHeaders);

    bool checkExpired = true;

    QHash<QByteArray, QByteArray> cacheControl;
    auto value = cacheHeaders.value(QHttpHeaders::WellKnownHeader::CacheControl);
    if (!value.empty()) {
        cacheControl = parseHttpOptionHeader(value);
        QByteArray maxAge = cacheControl.value("max-age"_ba);
        if (!maxAge.isEmpty()) {
            checkExpired = false;
            QDateTime dt = QDateTime::currentDateTimeUtc();
            dt = dt.addSecs(maxAge.toInt());
            metaData.setExpirationDate(dt);
        }
    }
    if (checkExpired) {
        if (const auto value = cacheHeaders.value(
                    QHttpHeaders::WellKnownHeader::Expires); !value.isEmpty()) {
            QDateTime expiredDateTime = QNetworkHeadersPrivate::fromHttpDate(value);
            metaData.setExpirationDate(expiredDateTime);
        }
    }

    if (const auto value = cacheHeaders.value(
                QHttpHeaders::WellKnownHeader::LastModified); !value.isEmpty()) {
        metaData.setLastModified(QNetworkHeadersPrivate::fromHttpDate(value));
    }


    bool canDiskCache;
    // only cache GET replies by default, all other replies (POST, PUT, DELETE)
    //  are not cacheable by default (according to RFC 2616 section 9)
    if (httpRequest.operation() == QHttpNetworkRequest::Get) {

        canDiskCache = true;
        // HTTP/1.1. Check the Cache-Control header
        if (cacheControl.contains("no-store"_ba))
            canDiskCache = false;

    // responses to POST might be cacheable
    } else if (httpRequest.operation() == QHttpNetworkRequest::Post) {

        canDiskCache = false;
        // some pages contain "expires:" and "cache-control: no-cache" field,
        // so we only might cache POST requests if we get "cache-control: max-age ..."
        if (cacheControl.contains("max-age"_ba))
            canDiskCache = true;

    // responses to PUT and DELETE are not cacheable
    } else {
        canDiskCache = false;
    }

    metaData.setSaveToDisk(canDiskCache);
    QNetworkCacheMetaData::AttributesMap attributes;
    if (statusCode != 304) {
        // update the status code
        attributes.insert(QNetworkRequest::HttpStatusCodeAttribute, statusCode);
        attributes.insert(QNetworkRequest::HttpReasonPhraseAttribute, reasonPhrase);
    } else {
        // this is a redirection, keep the attributes intact
        attributes = oldMetaData.attributes();
    }
    metaData.setAttributes(attributes);
    return metaData;
}